

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::arrayOrStreamToStreamArray
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this,string *description,string *all_description)

{
  bool bVar1;
  int iVar2;
  QPDF *pQVar3;
  QPDFObjGen local_310;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  reference local_2c8;
  QPDFObjectHandle *item_1;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_2a0 [6];
  bool first;
  allocator<char> local_279;
  string local_278;
  QPDFExc local_258;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  string local_128;
  QPDFExc local_108;
  pair<bool,_QPDFObjectHandle> local_88;
  undefined1 local_70 [8];
  QPDFObjectHandle item;
  int i;
  int n_items;
  undefined1 local_48 [8];
  Array array;
  string *all_description_local;
  string *description_local;
  QPDFObjectHandle *this_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *result;
  
  std::__cxx11::string::operator=((string *)all_description,(string *)description);
  array.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl._7_1_ = 0;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(__return_storage_ptr__);
  as_array((Array *)local_48,this,strict);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_48);
  if (bVar1) {
    iVar2 = ::qpdf::Array::size((Array *)local_48);
    for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ = 0;
        item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ < iVar2;
        item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ =
             item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_ + 1) {
      ::qpdf::Array::at(&local_88,(Array *)local_48,
                        item.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ._4_4_);
      QPDFObjectHandle((QPDFObjectHandle *)local_70,&local_88.second);
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_88);
      bVar1 = isStream((QPDFObjectHandle *)local_70);
      if (bVar1) {
        std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
        emplace_back<QPDFObjectHandle&>
                  ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                   __return_storage_ptr__,(QPDFObjectHandle *)local_70);
      }
      else {
        QTC::TC("qpdf","QPDFObjectHandle non-stream in stream array",0);
        pQVar3 = getOwningQPDF((QPDFObjectHandle *)local_70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
        std::operator+(&local_190,description,": item index ");
        std::__cxx11::to_string
                  (&local_1b0,
                   item.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                   _4_4_);
        std::operator+(&local_170,&local_190,&local_1b0);
        std::operator+(&local_150,&local_170," (from 0)");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"ignoring non-stream in an array of streams",&local_1d1);
        QPDFExc::QPDFExc(&local_108,qpdf_e_damaged_pdf,&local_128,&local_150,0,&local_1d0);
        warn(pQVar3,&local_108);
        QPDFExc::~QPDFExc(&local_108);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator(&local_129);
      }
      ~QPDFObjectHandle((QPDFObjectHandle *)local_70);
    }
  }
  else {
    bVar1 = isStream(this);
    if (bVar1) {
      std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
      emplace_back<QPDFObjectHandle&>
                ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__
                 ,this);
    }
    else {
      bVar1 = isNull(this);
      if (!bVar1) {
        pQVar3 = getOwningQPDF(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_279);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   " object is supposed to be a stream or an array of streams but is neither",
                   (allocator<char> *)((long)&__range1 + 7));
        QPDFExc::QPDFExc(&local_258,qpdf_e_damaged_pdf,&local_278,description,0,(string *)local_2a0)
        ;
        warn(pQVar3,&local_258);
        QPDFExc::~QPDFExc(&local_258);
        std::__cxx11::string::~string((string *)local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
      }
    }
  }
  ::qpdf::Array::~Array((Array *)local_48);
  __range1._6_1_ = 1;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     (__return_storage_ptr__);
  item_1 = (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                     (__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&item_1), bVar1) {
    local_2c8 = __gnu_cxx::
                __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                ::operator*(&__end1);
    if ((__range1._6_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)all_description,",");
    }
    else {
      __range1._6_1_ = 0;
    }
    local_310 = getObjGen(local_2c8);
    QPDFObjGen::unparse_abi_cxx11_(&local_308,&local_310,' ');
    std::operator+(&local_2e8," stream ",&local_308);
    std::__cxx11::string::operator+=((string *)all_description,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::arrayOrStreamToStreamArray(
    std::string const& description, std::string& all_description)
{
    all_description = description;
    std::vector<QPDFObjectHandle> result;
    if (auto array = as_array(strict)) {
        int n_items = array.size();
        for (int i = 0; i < n_items; ++i) {
            QPDFObjectHandle item = array.at(i).second;
            if (item.isStream()) {
                result.emplace_back(item);
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle non-stream in stream array");
                warn(
                    item.getOwningQPDF(),
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        "",
                        description + ": item index " + std::to_string(i) + " (from 0)",
                        0,
                        "ignoring non-stream in an array of streams"));
            }
        }
    } else if (isStream()) {
        result.emplace_back(*this);
    } else if (!isNull()) {
        warn(
            getOwningQPDF(),
            QPDFExc(
                qpdf_e_damaged_pdf,
                "",
                description,
                0,
                " object is supposed to be a stream or an array of streams but is neither"));
    }

    bool first = true;
    for (auto const& item: result) {
        if (first) {
            first = false;
        } else {
            all_description += ",";
        }
        all_description += " stream " + item.getObjGen().unparse(' ');
    }

    return result;
}